

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR CorUnix::CPalSynchronizationManager::DelegateSignalingToRemoteProcess
                    (CPalThread *pthrCurrent,DWORD dwTargetProcessId,SHMPTR shridSynchData)

{
  SHMPTR SVar1;
  CSynchData *this;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  SHMPTR *pSVar5;
  BYTE *extraout_RDX;
  BYTE *pBVar6;
  undefined4 in_register_00000034;
  char *pMsg;
  DWORD dwProcessId;
  FILE *pFVar8;
  long in_FS_OFFSET;
  SHMPTR local_50;
  SHMPTR shridSynchData_local;
  undefined1 local_3d;
  DWORD dwSigCount;
  BYTE rgSendBuf [13];
  CSynchData *pCVar7;
  
  pMsg = (char *)CONCAT44(in_register_00000034,dwTargetProcessId);
  rgSendBuf._5_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_50 = shridSynchData;
  this = (CSynchData *)SHMPtrToPtr(shridSynchData);
  if (gPID == dwTargetProcessId) {
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x98f);
    pMsg = "Expression: gPID != dwTargetProcessId, Description:  called on local thread\n";
    fprintf(_stderr,"Expression: gPID != dwTargetProcessId, Description:  called on local thread\n")
    ;
  }
  if (shridSynchData == 0) {
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x990);
    pMsg = "Expression: NULLSharedID != shridSynchData, Description: NULL shared identifier\n";
    fprintf(_stderr,
            "Expression: NULLSharedID != shridSynchData, Description: NULL shared identifier\n");
  }
  if (this == (CSynchData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x993);
    pMsg = "Expression: NULL != psdSynchData, Description: Bad shared SynchData identifier (%p)\n";
    fprintf(_stderr,
            "Expression: NULL != psdSynchData, Description: Bad shared SynchData identifier (%p)\n",
            shridSynchData);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    pCVar7 = this;
    shridSynchData_local._4_4_ = CSynchData::GetSignalCount(this);
    dwProcessId = (DWORD)pCVar7;
    LOCK();
    this->m_lRefCount = this->m_lRefCount + 1;
    UNLOCK();
    puVar2 = &local_3d;
    local_3d = 2;
    pSVar5 = &local_50;
    for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
      puVar2 = puVar2 + 1;
      SVar1 = *pSVar5;
      pMsg = (char *)CONCAT71((int7)((ulong)pMsg >> 8),(char)SVar1);
      pSVar5 = (SHMPTR *)((long)pSVar5 + 1);
      *puVar2 = (char)SVar1;
    }
    for (lVar4 = 1; (int)lVar4 != 5; lVar4 = lVar4 + 1) {
      puVar2[lVar4] = *(undefined1 *)((long)&shridSynchData_local + lVar4 + 3);
    }
    pBVar6 = rgSendBuf + 6;
    if (pBVar6 < puVar2 + lVar4) {
      fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x9b7);
      pMsg = "Expression: pbyDst <= rgSendBuf + MsgSize + 1, Description: Buffer overrun";
      pFVar8 = _stderr;
      fprintf(_stderr,"Expression: pbyDst <= rgSendBuf + MsgSize + 1, Description: Buffer overrun");
      dwProcessId = (DWORD)pFVar8;
      pBVar6 = extraout_RDX;
    }
    SendMsgToRemoteWorker(dwProcessId,(BYTE *)pMsg,(int)pBVar6);
    if (PAL_InitializeChakraCoreCalled != false) {
      CSynchData::Release(this,pthrCurrent);
      if (*(long *)(in_FS_OFFSET + 0x28) == rgSendBuf._5_8_) {
        return 0x54f;
      }
      __stack_chk_fail();
    }
  }
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::DelegateSignalingToRemoteProcess(
        CPalThread * pthrCurrent,
        DWORD dwTargetProcessId,
        SharedID shridSynchData)
    {
        const int MsgSize = sizeof(BYTE) + sizeof(SharedID) + sizeof(DWORD);
        int i;
        PAL_ERROR palErr = NO_ERROR;
        BYTE rgSendBuf[MsgSize];
        BYTE * pbySrc, * pbyDst = rgSendBuf;
        DWORD dwSigCount;
        CSynchData * psdSynchData =
            SharedIDToTypePointer(CSynchData, shridSynchData);

        _ASSERT_MSG(gPID != dwTargetProcessId,
                    " called on local thread\n");
        _ASSERT_MSG(NULLSharedID != shridSynchData, "NULL shared identifier\n");
        _ASSERT_MSG(NULL != psdSynchData,
                    "Bad shared SynchData identifier (%p)\n",
                    (VOID*)shridSynchData);
        _ASSERT_MSG(MsgSize <= PIPE_BUF,
                    "Message too long [MsgSize=%d PIPE_BUF=%d]\n",
                    MsgSize, (int)PIPE_BUF);

        TRACE("Transfering wait all signaling to remote process pid=%x "
              "by sending cmd=%u and shridSynchData=%p over process pipe\n",
              dwTargetProcessId, SynchWorkerCmdDelegatedObjectSignaling,
              (VOID *)shridSynchData);

        dwSigCount = psdSynchData->GetSignalCount();

        // AddRef SynchData to be marshaled to remote process
        psdSynchData->AddRef();

        //
        // Prepare the message
        //

        // Cmd
        *pbyDst++ = (BYTE)(SynchWorkerCmdDelegatedObjectSignaling & 0xFF);

        // CSynchData (not aligned, copy byte by byte)
        pbySrc = (BYTE *)&shridSynchData;
        for (i=0; i<(int)sizeof(SharedID); i++)
        {
            *pbyDst++ = *pbySrc++;
        }

        // Signal Count (not aligned, copy byte by byte)
        pbySrc = (BYTE *)&dwSigCount;
        for (i=0; i<(int)sizeof(DWORD); i++)
        {
            *pbyDst++ = *pbySrc++;
        }

        _ASSERT_MSG(pbyDst <= rgSendBuf + MsgSize + 1, "Buffer overrun");

        // Send the message
        palErr = SendMsgToRemoteWorker(dwTargetProcessId, rgSendBuf,
                                       MsgSize);
        if (NO_ERROR != palErr)
        {
            TRACE("Failed sending message to remote worker in process %u\n",
                  dwTargetProcessId);
            // Undo refcounting
            psdSynchData->Release(pthrCurrent);
            goto WUT_exit;
        }

    WUT_exit:
        return palErr;
    }